

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime_tests.c
# Opt level: O0

void run_tests(secp256k1_context *ctx,uchar *key)

{
  int iVar1;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  unsigned_long _zzq_result_46;
  unsigned_long _zzq_args_46 [6];
  unsigned_long _zzq_result_45;
  unsigned_long _zzq_args_45 [6];
  unsigned_long _zzq_result_44;
  unsigned_long _zzq_args_44 [6];
  unsigned_long _zzq_result_43;
  unsigned_long _zzq_args_43 [6];
  unsigned_long _zzq_result_42;
  unsigned_long _zzq_args_42 [6];
  unsigned_long _zzq_result_41;
  unsigned_long _zzq_args_41 [6];
  unsigned_long _zzq_result_40;
  unsigned_long _zzq_args_40 [6];
  unsigned_long _zzq_result_39;
  unsigned_long _zzq_args_39 [6];
  unsigned_long _zzq_result_38;
  unsigned_long _zzq_args_38 [6];
  unsigned_long _zzq_result_37;
  unsigned_long _zzq_args_37 [6];
  unsigned_long _zzq_result_36;
  unsigned_long _zzq_args_36 [6];
  unsigned_long _zzq_result_35;
  unsigned_long _zzq_args_35 [6];
  unsigned_long _zzq_result_34;
  unsigned_long _zzq_args_34 [6];
  unsigned_long _zzq_result_33;
  unsigned_long _zzq_args_33 [6];
  unsigned_long _zzq_result_32;
  unsigned_long _zzq_args_32 [6];
  unsigned_long _zzq_result_31;
  unsigned_long _zzq_args_31 [6];
  unsigned_long _zzq_result_30;
  unsigned_long _zzq_args_30 [6];
  unsigned_long _zzq_result_29;
  unsigned_long _zzq_args_29 [6];
  unsigned_long _zzq_result_28;
  unsigned_long _zzq_args_28 [6];
  uchar extra_input [32];
  secp256k1_musig_partial_sig partial_sig;
  secp256k1_musig_session session;
  secp256k1_musig_keyagg_cache cache;
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_musig_pubnonce *pubnonce_ptr [1];
  secp256k1_musig_pubnonce pubnonce;
  secp256k1_musig_secnonce secnonce;
  uint64_t nonrepeating_cnt;
  uchar session_secrand [32];
  secp256k1_xonly_pubkey agg_pk;
  secp256k1_pubkey *pk_ptr [1];
  secp256k1_pubkey pk;
  unsigned_long _zzq_result_27;
  unsigned_long _zzq_args_27 [6];
  unsigned_long _zzq_result_26;
  unsigned_long _zzq_args_26 [6];
  unsigned_long _zzq_result_25;
  unsigned_long _zzq_args_25 [6];
  unsigned_long _zzq_result_24;
  unsigned_long _zzq_args_24 [6];
  unsigned_long _zzq_result_23;
  unsigned_long _zzq_args_23 [6];
  unsigned_long _zzq_result_22;
  unsigned_long _zzq_args_22 [6];
  unsigned_long _zzq_result_21;
  unsigned_long _zzq_args_21 [6];
  unsigned_long _zzq_result_20;
  unsigned_long _zzq_args_20 [6];
  unsigned_long _zzq_result_19;
  unsigned_long _zzq_args_19 [6];
  unsigned_long _zzq_result_18;
  unsigned_long _zzq_args_18 [6];
  unsigned_long _zzq_result_17;
  unsigned_long _zzq_args_17 [6];
  unsigned_long _zzq_result_16;
  unsigned_long _zzq_args_16 [6];
  unsigned_long _zzq_result_15;
  unsigned_long _zzq_args_15 [6];
  unsigned_long _zzq_result_14;
  unsigned_long _zzq_args_14 [6];
  unsigned_long _zzq_result_13;
  unsigned_long _zzq_args_13 [6];
  unsigned_long _zzq_result_12;
  unsigned_long _zzq_args_12 [6];
  unsigned_long _zzq_result_11;
  unsigned_long _zzq_args_11 [6];
  unsigned_long _zzq_result_10;
  unsigned_long _zzq_args_10 [6];
  unsigned_long _zzq_result_9;
  unsigned_long _zzq_args_9 [6];
  unsigned_long _zzq_result_8;
  unsigned_long _zzq_args_8 [6];
  unsigned_long _zzq_result_7;
  unsigned_long _zzq_args_7 [6];
  unsigned_long _zzq_result_6;
  unsigned_long _zzq_args_6 [6];
  unsigned_long _zzq_result_5;
  unsigned_long _zzq_args_5 [6];
  unsigned_long _zzq_result_4;
  unsigned_long _zzq_args_4 [6];
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_args_3 [6];
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  uchar ellswift [64];
  secp256k1_keypair keypair;
  uchar spubkey [33];
  uchar sig [74];
  uchar msg [32];
  int ret;
  int i;
  size_t outputlen;
  size_t siglen;
  secp256k1_pubkey pubkey;
  secp256k1_ecdsa_signature signature;
  char local_cc8;
  undefined7 uStack_cc7;
  undefined8 local_cc0;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined1 local_ca2 [36];
  undefined1 local_c7e [133];
  undefined1 local_bf9 [197];
  undefined1 local_b34 [132];
  undefined1 *local_ab0;
  undefined1 local_aa8 [132];
  undefined1 local_a24 [132];
  undefined8 local_9a0;
  char local_998;
  undefined7 uStack_997;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined1 local_970 [64];
  undefined1 *local_930;
  undefined1 local_928 [64];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  int *local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  int *local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined8 local_818;
  int *local_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined1 *local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 *local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  int *local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  char *local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  int *local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 *local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  int *local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  char *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  int *local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  char *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  int *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  int *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  int *local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  int *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  int *local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined1 *local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [96];
  undefined1 local_148 [48];
  undefined1 local_118 [80];
  char local_c8 [32];
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [64];
  undefined1 local_50 [64];
  undefined8 *local_10;
  undefined8 local_8;
  
  local_98 = 0x4a;
  local_a0 = 0x21;
  for (local_a4 = 0; local_a4 < 0x20; local_a4 = local_a4 + 1) {
    local_c8[local_a4] = (char)local_a4 + '\x01';
  }
  local_218 = 0x4d430001;
  local_208 = 0x20;
  local_200 = 0;
  local_1f8 = 0;
  local_1f0 = 0;
  local_220 = 0;
  local_228 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_a8 = secp256k1_ec_pubkey_create(in_RDI,local_90,in_RSI);
  local_258 = 0x4d430002;
  local_250 = local_90;
  local_248 = 0x40;
  local_240 = 0;
  local_238 = 0;
  local_230 = 0;
  local_260 = 0;
  local_268 = 0;
  local_298 = 0x4d430002;
  local_290 = &local_a8;
  local_288 = 4;
  local_280 = 0;
  local_278 = 0;
  local_270 = 0;
  local_2a0 = 0;
  local_2a8 = 0;
  if (local_a8 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x6b,"test condition failed: ret");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_serialize(local_8,local_148,&local_a0,local_90,0x102);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x6c,
            "test condition failed: secp256k1_ec_pubkey_serialize(ctx, spubkey, &outputlen, &pubkey, SECP256K1_EC_COMPRESSED) == 1"
           );
    abort();
  }
  local_2d8 = 0x4d430001;
  local_2d0 = local_10;
  local_2c8 = 0x20;
  local_2c0 = 0;
  local_2b8 = 0;
  local_2b0 = 0;
  local_2e0 = 0;
  local_2e8 = 0;
  local_a8 = secp256k1_ecdsa_sign(local_8,local_50,local_c8,local_10,0);
  local_318 = 0x4d430002;
  local_310 = local_50;
  local_308 = 0x40;
  local_300 = 0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_320 = 0;
  local_328 = 0;
  local_358 = 0x4d430002;
  local_350 = &local_a8;
  local_348 = 4;
  local_340 = 0;
  local_338 = 0;
  local_330 = 0;
  local_360 = 0;
  local_368 = 0;
  if (local_a8 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x73,"test condition failed: ret");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_der(local_8,local_118,&local_98);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x74,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(ctx, sig, &siglen, &signature)"
           );
    abort();
  }
  local_398 = 0x4d430001;
  local_390 = local_10;
  local_388 = 0x20;
  local_380 = 0;
  local_378 = 0;
  local_370 = 0;
  local_3a0 = 0;
  local_3a8 = 0;
  local_a8 = secp256k1_ecdh(local_8,local_c8,local_90,local_10,0);
  local_3d8 = 0x4d430002;
  local_3d0 = &local_a8;
  local_3c8 = 4;
  local_3c0 = 0;
  local_3b8 = 0;
  local_3b0 = 0;
  local_3e0 = 0;
  local_3e8 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x7b,"test condition failed: ret == 1");
    abort();
  }
  local_418 = 0x4d430001;
  local_410 = local_10;
  local_408 = 0x20;
  local_400 = 0;
  local_3f8 = 0;
  local_3f0 = 0;
  local_420 = 0;
  local_428 = 0;
  local_a8 = secp256k1_ec_seckey_verify(local_8,local_10);
  local_458 = 0x4d430002;
  local_450 = &local_a8;
  local_448 = 4;
  local_440 = 0;
  local_438 = 0;
  local_430 = 0;
  local_460 = 0;
  local_468 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x8c,"test condition failed: ret == 1");
    abort();
  }
  local_498 = 0x4d430001;
  local_490 = local_10;
  local_488 = 0x20;
  local_480 = 0;
  local_478 = 0;
  local_470 = 0;
  local_4a0 = 0;
  local_4a8 = 0;
  local_a8 = secp256k1_ec_seckey_negate(local_8,local_10);
  local_4d8 = 0x4d430002;
  local_4d0 = &local_a8;
  local_4c8 = 4;
  local_4c0 = 0;
  local_4b8 = 0;
  local_4b0 = 0;
  local_4e0 = 0;
  local_4e8 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x91,"test condition failed: ret == 1");
    abort();
  }
  local_518 = 0x4d430001;
  local_510 = local_10;
  local_508 = 0x20;
  local_500 = 0;
  local_4f8 = 0;
  local_4f0 = 0;
  local_520 = 0;
  local_528 = 0;
  local_558 = 0x4d430001;
  local_550 = local_c8;
  local_548 = 0x20;
  local_540 = 0;
  local_538 = 0;
  local_530 = 0;
  local_560 = 0;
  local_568 = 0;
  local_a8 = secp256k1_ec_seckey_tweak_add(local_8,local_10,local_c8);
  local_598 = 0x4d430002;
  local_590 = &local_a8;
  local_588 = 4;
  local_580 = 0;
  local_578 = 0;
  local_570 = 0;
  local_5a0 = 0;
  local_5a8 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x97,"test condition failed: ret == 1");
    abort();
  }
  local_5d8 = 0x4d430001;
  local_5d0 = local_10;
  local_5c8 = 0x20;
  local_5c0 = 0;
  local_5b8 = 0;
  local_5b0 = 0;
  local_5e0 = 0;
  local_5e8 = 0;
  local_618 = 0x4d430001;
  local_610 = local_c8;
  local_608 = 0x20;
  local_600 = 0;
  local_5f8 = 0;
  local_5f0 = 0;
  local_620 = 0;
  local_628 = 0;
  local_a8 = secp256k1_ec_seckey_tweak_mul(local_8,local_10,local_c8);
  local_658 = 0x4d430002;
  local_650 = &local_a8;
  local_648 = 4;
  local_640 = 0;
  local_638 = 0;
  local_630 = 0;
  local_660 = 0;
  local_668 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0x9d,"test condition failed: ret == 1");
    abort();
  }
  local_698 = 0x4d430001;
  local_690 = local_10;
  local_688 = 0x20;
  local_680 = 0;
  local_678 = 0;
  local_670 = 0;
  local_6a0 = 0;
  local_6a8 = 0;
  local_a8 = secp256k1_keypair_create(local_8,local_1a8,local_10);
  local_6d8 = 0x4d430002;
  local_6d0 = &local_a8;
  local_6c8 = 4;
  local_6c0 = 0;
  local_6b8 = 0;
  local_6b0 = 0;
  local_6e0 = 0;
  local_6e8 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xa4,"test condition failed: ret == 1");
    abort();
  }
  local_718 = 0x4d430002;
  local_710 = local_c8;
  local_708 = 0x20;
  local_700 = 0;
  local_6f8 = 0;
  local_6f0 = 0;
  local_720 = 0;
  local_728 = 0;
  local_a8 = secp256k1_keypair_xonly_tweak_add(local_8,local_1a8,local_c8);
  local_758 = 0x4d430002;
  local_750 = &local_a8;
  local_748 = 4;
  local_740 = 0;
  local_738 = 0;
  local_730 = 0;
  local_760 = 0;
  local_768 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xaa,"test condition failed: ret == 1");
    abort();
  }
  local_798 = 0x4d430001;
  local_790 = local_10;
  local_788 = 0x20;
  local_780 = 0;
  local_778 = 0;
  local_770 = 0;
  local_7a0 = 0;
  local_7a8 = 0;
  local_7d8 = 0x4d430001;
  local_7d0 = local_1a8;
  local_7c8 = 0x60;
  local_7c0 = 0;
  local_7b8 = 0;
  local_7b0 = 0;
  local_7e0 = 0;
  local_7e8 = 0;
  local_a8 = secp256k1_keypair_sec(local_8,local_10,local_1a8);
  local_818 = 0x4d430002;
  local_810 = &local_a8;
  local_808 = 4;
  local_800 = 0;
  local_7f8 = 0;
  local_7f0 = 0;
  local_820 = 0;
  local_828 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xb0,"test condition failed: ret == 1");
    abort();
  }
  local_858 = 0x4d430001;
  local_850 = local_10;
  local_848 = 0x20;
  local_840 = 0;
  local_838 = 0;
  local_830 = 0;
  local_860 = 0;
  local_868 = 0;
  local_a8 = secp256k1_keypair_create(local_8,local_1a8,local_10);
  local_898 = 0x4d430002;
  local_890 = &local_a8;
  local_888 = 4;
  local_880 = 0;
  local_878 = 0;
  local_870 = 0;
  local_8a0 = 0;
  local_8a8 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xb7,"test condition failed: ret == 1");
    abort();
  }
  local_a8 = secp256k1_schnorrsig_sign32(local_8,local_118,local_c8,local_1a8,0);
  local_8d8 = 0x4d430002;
  local_8d0 = &local_a8;
  local_8c8 = 4;
  local_8c0 = 0;
  local_8b8 = 0;
  local_8b0 = 0;
  local_8e0 = 0;
  local_8e8 = 0;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xba,"test condition failed: ret == 1");
    abort();
  }
  local_9a0 = 0;
  local_930 = local_928;
  local_ab0 = local_aa8;
  local_990 = local_10[1];
  local_988 = local_10[2];
  local_980 = local_10[3];
  local_998 = (char)*local_10;
  _local_998 = CONCAT71((int7)((ulong)*local_10 >> 8),local_998 + '\x01');
  local_cc0 = local_10[1];
  local_cb8 = local_10[2];
  local_cb0 = local_10[3];
  local_cc8 = (char)*local_10;
  _local_cc8 = CONCAT71((int7)((ulong)*local_10 >> 8),local_cc8 + '\x02');
  iVar1 = secp256k1_keypair_create(local_8,local_1a8,local_10);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xd5,"test condition failed: secp256k1_keypair_create(ctx, &keypair, key)");
    abort();
  }
  iVar1 = secp256k1_keypair_pub(local_8,local_928,local_1a8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xd6,"test condition failed: secp256k1_keypair_pub(ctx, &pk, &keypair)");
    abort();
  }
  iVar1 = secp256k1_musig_pubkey_agg(local_8,local_970,local_bf9,&local_930,1);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xd7,
            "test condition failed: secp256k1_musig_pubkey_agg(ctx, &agg_pk, &cache, pk_ptr, 1)");
    abort();
  }
  local_a8 = secp256k1_musig_nonce_gen
                       (local_8,local_a24,local_aa8,&local_998,local_10,local_928,local_c8,local_bf9
                        ,&local_cc8);
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xde,"test condition failed: ret == 1");
    abort();
  }
  local_a8 = secp256k1_musig_nonce_gen_counter
                       (local_8,local_a24,local_aa8,local_9a0,local_1a8,local_c8,local_bf9,
                        &local_cc8);
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xe1,"test condition failed: ret == 1");
    abort();
  }
  iVar1 = secp256k1_musig_nonce_agg(local_8,local_b34,&local_ab0);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xe3,
            "test condition failed: secp256k1_musig_nonce_agg(ctx, &aggnonce, pubnonce_ptr, 1)");
    abort();
  }
  iVar1 = secp256k1_musig_nonce_process(local_8,local_c7e,local_b34,local_c8,local_bf9);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xe6,
            "test condition failed: secp256k1_musig_nonce_process(ctx, &session, &aggnonce, msg, &cache) == 1"
           );
    abort();
  }
  local_a8 = secp256k1_keypair_create(local_8,local_1a8,local_10);
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xea,"test condition failed: ret == 1");
    abort();
  }
  local_a8 = secp256k1_musig_partial_sign(local_8,local_ca2,local_a24,local_1a8,local_bf9,local_c7e)
  ;
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xed,"test condition failed: ret == 1");
    abort();
  }
  local_a8 = secp256k1_ellswift_create(local_8,local_1e8,local_10);
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xf5,"test condition failed: ret == 1");
    abort();
  }
  local_a8 = secp256k1_ellswift_create(local_8,local_1e8,local_10);
  if (local_a8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
            ,0xfa,"test condition failed: ret == 1");
    abort();
  }
  local_a4 = 0;
  while( true ) {
    local_a8 = 1;
    if (1 < local_a4) {
      return;
    }
    local_a8 = secp256k1_ellswift_xdh
                         (local_8,local_c8,local_1e8,local_1e8,local_10,local_a4,
                          _secp256k1_ellswift_xdh_hash_function_bip324,0);
    if (local_a8 != 1) break;
    local_a8 = secp256k1_ellswift_xdh
                         (local_8,local_c8,local_1e8,local_1e8,local_10,local_a4,
                          _secp256k1_ellswift_xdh_hash_function_prefix,"test");
    if (local_a8 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
              ,0x107,"test condition failed: ret == 1");
      abort();
    }
    local_a4 = local_a4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ctime_tests.c"
          ,0x101,"test condition failed: ret == 1");
  abort();
}

Assistant:

static void run_tests(secp256k1_context *ctx, unsigned char *key) {
    secp256k1_ecdsa_signature signature;
    secp256k1_pubkey pubkey;
    size_t siglen = 74;
    size_t outputlen = 33;
    int i;
    int ret;
    unsigned char msg[32];
    unsigned char sig[74];
    unsigned char spubkey[33];
#ifdef ENABLE_MODULE_RECOVERY
    secp256k1_ecdsa_recoverable_signature recoverable_signature;
    int recid;
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
    secp256k1_keypair keypair;
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    unsigned char ellswift[64];
    static const unsigned char prefix[64] = {'t', 'e', 's', 't'};
#endif

    for (i = 0; i < 32; i++) {
        msg[i] = i + 1;
    }

    /* Test keygen. */
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ec_pubkey_create(ctx, &pubkey, key);
    SECP256K1_CHECKMEM_DEFINE(&pubkey, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret);
    CHECK(secp256k1_ec_pubkey_serialize(ctx, spubkey, &outputlen, &pubkey, SECP256K1_EC_COMPRESSED) == 1);

    /* Test signing. */
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ecdsa_sign(ctx, &signature, msg, key, NULL, NULL);
    SECP256K1_CHECKMEM_DEFINE(&signature, sizeof(secp256k1_ecdsa_signature));
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret);
    CHECK(secp256k1_ecdsa_signature_serialize_der(ctx, sig, &siglen, &signature));

#ifdef ENABLE_MODULE_ECDH
    /* Test ECDH. */
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ecdh(ctx, msg, &pubkey, key, NULL, NULL);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);
#endif

#ifdef ENABLE_MODULE_RECOVERY
    /* Test signing a recoverable signature. */
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ecdsa_sign_recoverable(ctx, &recoverable_signature, msg, key, NULL, NULL);
    SECP256K1_CHECKMEM_DEFINE(&recoverable_signature, sizeof(recoverable_signature));
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret);
    CHECK(secp256k1_ecdsa_recoverable_signature_serialize_compact(ctx, sig, &recid, &recoverable_signature));
    CHECK(recid >= 0 && recid <= 3);
#endif

    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ec_seckey_verify(ctx, key);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ec_seckey_negate(ctx, key);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    SECP256K1_CHECKMEM_UNDEFINE(msg, 32);
    ret = secp256k1_ec_seckey_tweak_add(ctx, key, msg);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    SECP256K1_CHECKMEM_UNDEFINE(msg, 32);
    ret = secp256k1_ec_seckey_tweak_mul(ctx, key, msg);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    /* Test keypair_create and keypair_xonly_tweak_add. */
#ifdef ENABLE_MODULE_EXTRAKEYS
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_keypair_create(ctx, &keypair, key);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    /* The tweak is not treated as a secret in keypair_tweak_add */
    SECP256K1_CHECKMEM_DEFINE(msg, 32);
    ret = secp256k1_keypair_xonly_tweak_add(ctx, &keypair, msg);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    SECP256K1_CHECKMEM_UNDEFINE(&keypair, sizeof(keypair));
    ret = secp256k1_keypair_sec(ctx, key, &keypair);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_keypair_create(ctx, &keypair, key);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);
    ret = secp256k1_schnorrsig_sign32(ctx, sig, msg, &keypair, NULL);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);
#endif

#ifdef ENABLE_MODULE_MUSIG
    {
        secp256k1_pubkey pk;
        const secp256k1_pubkey *pk_ptr[1];
        secp256k1_xonly_pubkey agg_pk;
        unsigned char session_secrand[32];
        uint64_t nonrepeating_cnt = 0;
        secp256k1_musig_secnonce secnonce;
        secp256k1_musig_pubnonce pubnonce;
        const secp256k1_musig_pubnonce *pubnonce_ptr[1];
        secp256k1_musig_aggnonce aggnonce;
        secp256k1_musig_keyagg_cache cache;
        secp256k1_musig_session session;
        secp256k1_musig_partial_sig partial_sig;
        unsigned char extra_input[32];

        pk_ptr[0] = &pk;
        pubnonce_ptr[0] = &pubnonce;
        SECP256K1_CHECKMEM_DEFINE(key, 32);
        memcpy(session_secrand, key, sizeof(session_secrand));
        session_secrand[0] = session_secrand[0] + 1;
        memcpy(extra_input, key, sizeof(extra_input));
        extra_input[0] = extra_input[0] + 2;

        CHECK(secp256k1_keypair_create(ctx, &keypair, key));
        CHECK(secp256k1_keypair_pub(ctx, &pk, &keypair));
        CHECK(secp256k1_musig_pubkey_agg(ctx, &agg_pk, &cache, pk_ptr, 1));

        SECP256K1_CHECKMEM_UNDEFINE(key, 32);
        SECP256K1_CHECKMEM_UNDEFINE(session_secrand, sizeof(session_secrand));
        SECP256K1_CHECKMEM_UNDEFINE(extra_input, sizeof(extra_input));
        ret = secp256k1_musig_nonce_gen(ctx, &secnonce, &pubnonce, session_secrand, key, &pk, msg, &cache, extra_input);
        SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
        CHECK(ret == 1);
        ret = secp256k1_musig_nonce_gen_counter(ctx, &secnonce, &pubnonce, nonrepeating_cnt, &keypair, msg, &cache, extra_input);
        SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
        CHECK(ret == 1);

        CHECK(secp256k1_musig_nonce_agg(ctx, &aggnonce, pubnonce_ptr, 1));
        /* Make sure that previous tests don't undefine msg. It's not used as a secret here. */
        SECP256K1_CHECKMEM_DEFINE(msg, sizeof(msg));
        CHECK(secp256k1_musig_nonce_process(ctx, &session, &aggnonce, msg, &cache) == 1);

        ret = secp256k1_keypair_create(ctx, &keypair, key);
        SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
        CHECK(ret == 1);
        ret = secp256k1_musig_partial_sign(ctx, &partial_sig, &secnonce, &keypair, &cache, &session);
        SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
        CHECK(ret == 1);
    }
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ellswift_create(ctx, ellswift, key, NULL);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_ellswift_create(ctx, ellswift, key, ellswift);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret == 1);

    for (i = 0; i < 2; i++) {
        SECP256K1_CHECKMEM_UNDEFINE(key, 32);
        SECP256K1_CHECKMEM_DEFINE(&ellswift, sizeof(ellswift));
        ret = secp256k1_ellswift_xdh(ctx, msg, ellswift, ellswift, key, i, secp256k1_ellswift_xdh_hash_function_bip324, NULL);
        SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
        CHECK(ret == 1);

        SECP256K1_CHECKMEM_UNDEFINE(key, 32);
        SECP256K1_CHECKMEM_DEFINE(&ellswift, sizeof(ellswift));
        ret = secp256k1_ellswift_xdh(ctx, msg, ellswift, ellswift, key, i, secp256k1_ellswift_xdh_hash_function_prefix, (void *)prefix);
        SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
        CHECK(ret == 1);
    }

#endif
}